

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O3

void __thiscall
boost::deflate::deflate_stream_test::testFlushAtLiteralBufferFull(boost::deflate::
deflate_stream_test::ICompressor&)::fixture::fixture(boost::deflate::deflate_stream_test::
ICompressor&,unsigned_long,boost::deflate::Strategy_(void *this,ICompressor *c,size_t n,Strategy s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  long lVar11;
  int iVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  *(ICompressor **)this = c;
  *(long *)((long)this + 0x108) = (long)this + 0x118;
  *(undefined8 *)((long)this + 0x110) = 0;
  *(undefined1 *)((long)this + 0x118) = 0;
  (*c->_vptr_ICompressor[1])(c,8,0xf,1,(ulong)s);
  auVar9 = _DAT_0011ee60;
  auVar8 = _DAT_0011ee40;
  auVar7 = _DAT_0011ee30;
  auVar6 = _DAT_0011ee20;
  auVar5 = _DAT_0011ee10;
  auVar4 = _DAT_0011ee00;
  auVar3 = _DAT_0011edf0;
  auVar2 = _DAT_0011ede0;
  auVar1 = _DAT_0011edd0;
  lVar11 = 0;
  do {
    auVar13._8_4_ = (int)lVar11;
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar15 = (auVar13 | auVar8) ^ auVar9;
    iVar12 = auVar15._0_4_;
    iVar14 = auVar15._8_4_;
    auVar24._4_4_ = iVar12;
    auVar24._0_4_ = iVar12;
    auVar24._8_4_ = iVar14;
    auVar24._12_4_ = iVar14;
    auVar32._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar32._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar32._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar32._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar16._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar32;
    auVar15 = pshuflw(auVar24,auVar16,0xe8);
    auVar15 = packssdw(auVar15,auVar15);
    cVar10 = (char)lVar11;
    if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)((long)this + lVar11 + 8) = cVar10;
    }
    auVar15 = packssdw(auVar16,auVar16);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._0_4_ >> 8 & 1) != 0) {
      *(char *)((long)this + lVar11 + 9) = cVar10 + '\x01';
    }
    auVar15 = (auVar13 | auVar7) ^ auVar9;
    iVar12 = auVar15._0_4_;
    iVar14 = auVar15._8_4_;
    auVar25._4_4_ = iVar12;
    auVar25._0_4_ = iVar12;
    auVar25._8_4_ = iVar14;
    auVar25._12_4_ = iVar14;
    auVar33._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar33._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar33._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar33._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar17._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar33;
    auVar15 = packssdw(auVar25,auVar17);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._0_4_ >> 0x10 & 1) != 0) {
      *(char *)((long)this + lVar11 + 10) = cVar10 + '\x02';
    }
    auVar15 = pshufhw(auVar17,auVar17,0x84);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._0_4_ >> 0x18 & 1) != 0) {
      *(char *)((long)this + lVar11 + 0xb) = cVar10 + '\x03';
    }
    auVar15 = (auVar13 | auVar6) ^ auVar9;
    iVar12 = auVar15._0_4_;
    iVar14 = auVar15._8_4_;
    auVar26._4_4_ = iVar12;
    auVar26._0_4_ = iVar12;
    auVar26._8_4_ = iVar14;
    auVar26._12_4_ = iVar14;
    auVar34._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar34._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar34._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar34._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar18._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar34;
    auVar15 = pshuflw(auVar26,auVar18,0xe8);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)((long)this + lVar11 + 0xc) = cVar10 + '\x04';
    }
    auVar15 = packssdw(auVar18,auVar18);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._4_2_ >> 8 & 1) != 0) {
      *(char *)((long)this + lVar11 + 0xd) = cVar10 + '\x05';
    }
    auVar15 = (auVar13 | auVar5) ^ auVar9;
    iVar12 = auVar15._0_4_;
    iVar14 = auVar15._8_4_;
    auVar27._4_4_ = iVar12;
    auVar27._0_4_ = iVar12;
    auVar27._8_4_ = iVar14;
    auVar27._12_4_ = iVar14;
    auVar35._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar35._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar35._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar35._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar19._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar35;
    auVar15 = packssdw(auVar27,auVar19);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)((long)this + lVar11 + 0xe) = cVar10 + '\x06';
    }
    auVar15 = pshufhw(auVar19,auVar19,0x84);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._6_2_ >> 8 & 1) != 0) {
      *(char *)((long)this + lVar11 + 0xf) = cVar10 + '\a';
    }
    auVar15 = (auVar13 | auVar4) ^ auVar9;
    iVar12 = auVar15._0_4_;
    iVar14 = auVar15._8_4_;
    auVar28._4_4_ = iVar12;
    auVar28._0_4_ = iVar12;
    auVar28._8_4_ = iVar14;
    auVar28._12_4_ = iVar14;
    auVar36._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar36._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar36._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar36._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar20._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar36;
    auVar15 = pshuflw(auVar28,auVar20,0xe8);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)((long)this + lVar11 + 0x10) = cVar10 + '\b';
    }
    auVar15 = packssdw(auVar20,auVar20);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._8_2_ >> 8 & 1) != 0) {
      *(char *)((long)this + lVar11 + 0x11) = cVar10 + '\t';
    }
    auVar15 = (auVar13 | auVar3) ^ auVar9;
    iVar12 = auVar15._0_4_;
    iVar14 = auVar15._8_4_;
    auVar29._4_4_ = iVar12;
    auVar29._0_4_ = iVar12;
    auVar29._8_4_ = iVar14;
    auVar29._12_4_ = iVar14;
    auVar37._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar37._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar37._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar37._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar21._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar37;
    auVar15 = packssdw(auVar29,auVar21);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(char *)((long)this + lVar11 + 0x12) = cVar10 + '\n';
    }
    auVar15 = pshufhw(auVar21,auVar21,0x84);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._10_2_ >> 8 & 1) != 0) {
      *(char *)((long)this + lVar11 + 0x13) = cVar10 + '\v';
    }
    auVar15 = (auVar13 | auVar2) ^ auVar9;
    iVar12 = auVar15._0_4_;
    iVar14 = auVar15._8_4_;
    auVar30._4_4_ = iVar12;
    auVar30._0_4_ = iVar12;
    auVar30._8_4_ = iVar14;
    auVar30._12_4_ = iVar14;
    auVar38._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar38._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar38._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar38._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar22._0_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar15._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar15._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar38;
    auVar15 = pshuflw(auVar30,auVar22,0xe8);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)((long)this + lVar11 + 0x14) = cVar10 + '\f';
    }
    auVar15 = packssdw(auVar22,auVar22);
    auVar15 = packssdw(auVar15,auVar15);
    auVar15 = packsswb(auVar15,auVar15);
    if ((auVar15._12_2_ >> 8 & 1) != 0) {
      *(char *)((long)this + lVar11 + 0x15) = cVar10 + '\r';
    }
    auVar13 = (auVar13 | auVar1) ^ auVar9;
    iVar12 = auVar13._0_4_;
    iVar14 = auVar13._8_4_;
    auVar23._4_4_ = iVar12;
    auVar23._0_4_ = iVar12;
    auVar23._8_4_ = iVar14;
    auVar23._12_4_ = iVar14;
    auVar31._0_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar31._4_4_ = -(uint)(iVar12 < -0x7fffff01);
    auVar31._8_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar31._12_4_ = -(uint)(iVar14 < -0x7fffff01);
    auVar15._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar15._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar15._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar15._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar15 = auVar15 & auVar31;
    auVar13 = packssdw(auVar23,auVar15);
    auVar13 = packssdw(auVar13,auVar13);
    auVar13 = packsswb(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)((long)this + lVar11 + 0x16) = cVar10 + '\x0e';
    }
    auVar13 = pshufhw(auVar15,auVar15,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    auVar13 = packsswb(auVar13,auVar13);
    if ((auVar13._14_2_ >> 8 & 1) != 0) {
      *(char *)((long)this + lVar11 + 0x17) = cVar10 + '\x0f';
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x100);
  std::__cxx11::string::resize((long)this + 0x108,(char)n);
  (*c->_vptr_ICompressor[5])(c,(long)this + 8);
  (*c->_vptr_ICompressor[3])(c,0xff);
  (*c->_vptr_ICompressor[9])(c,*(undefined8 *)((long)this + 0x108));
  (*c->_vptr_ICompressor[7])(c,*(undefined8 *)((long)this + 0x110));
  return;
}

Assistant:

explicit fixture(ICompressor&c, std::size_t n, Strategy s) : c(c)
            {
                c.init(8, 15, 1, static_cast<int>(s));
                std::iota(in.begin(), in.end(), std::uint8_t{0});
                out.resize(n);
                c.next_in(in.data());
                c.avail_in(in.size());
                c.next_out(&out.front());
                c.avail_out(out.size());
            }